

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void deqp::gles31::Functional::checkProgramResourceUsage
               (Program *program,Functions *gl,TestLog *log)

{
  ostringstream *poVar1;
  Shader *shader;
  bool bVar2;
  deUint32 dVar3;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar4;
  NotSupportedError *this;
  byte bVar5;
  int ndx;
  long lVar6;
  int ndx_6;
  int iVar7;
  byte bVar8;
  long lVar9;
  anon_struct_8_2_e2d7eaeb restrictions [11];
  ShaderResourceUsage usage;
  undefined1 local_1b0 [384];
  
  bVar5 = 0;
  for (lVar9 = 0; pvVar4 = ProgramInterfaceDefinition::Program::getShaders(program),
      lVar9 < (int)((ulong)((long)(pvVar4->
                                  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar4->
                                 super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar9 = lVar9 + 1) {
    pvVar4 = ProgramInterfaceDefinition::Program::getShaders(program);
    shader = (pvVar4->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
             )._M_impl.super__Vector_impl_data._M_start[lVar9];
    getShaderResourceUsage(&usage,program,shader);
    switch(shader->m_shaderType) {
    case SHADERTYPE_VERTEX:
      restrictions[0].pname = 0x8869;
      restrictions[0].usage = usage.numInputVectors;
      restrictions[1].pname = 0x8b4a;
      restrictions[1].usage = usage.numDefaultBlockUniformComponents;
      restrictions[2].pname = 0x8dfb;
      restrictions[2].usage = usage.numUniformVectors;
      restrictions[3].pname = 0x8a2b;
      restrictions[3].usage = usage.numUniformBlocks;
      restrictions[4].pname = 0x9122;
      restrictions[4].usage = usage.numOutputComponents;
      restrictions[5].pname = 0x8b4c;
      restrictions[5].usage = usage.numSamplers;
      restrictions[6].pname = 0x92cc;
      restrictions[6].usage = usage.numAtomicCounterBuffers;
      restrictions[7].pname = 0x92d2;
      restrictions[7].usage = usage.numAtomicCounters;
      restrictions[8].pname = 0x90ca;
      restrictions[8].usage = usage.numImages;
      restrictions[9].pname = 0x8a31;
      restrictions[9].usage = usage.numCombinedUniformComponents;
      restrictions[10].pname = 0x90d6;
      restrictions[10].usage = usage.numShaderStorageBlocks;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Vertex shader:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar8 = 1;
      for (lVar6 = 0; lVar6 != 0xb; lVar6 = lVar6 + 1) {
        bVar2 = checkLimit(restrictions[lVar6].pname,restrictions[lVar6].usage,gl,log);
        bVar8 = bVar8 & bVar2;
      }
      break;
    case SHADERTYPE_FRAGMENT:
      restrictions[0].pname = 0x8b49;
      restrictions[0].usage = usage.numDefaultBlockUniformComponents;
      restrictions[1].pname = 0x8dfd;
      restrictions[1].usage = usage.numUniformVectors;
      restrictions[2].pname = 0x8a2d;
      restrictions[2].usage = usage.numUniformBlocks;
      restrictions[3].pname = 0x9125;
      restrictions[3].usage = usage.numInputComponents;
      restrictions[4].pname = 0x8872;
      restrictions[4].usage = usage.numSamplers;
      restrictions[5].pname = 0x92d0;
      restrictions[5].usage = usage.numAtomicCounterBuffers;
      restrictions[6].pname = 0x92d6;
      restrictions[6].usage = usage.numAtomicCounters;
      restrictions[7].pname = 0x90ce;
      restrictions[7].usage = usage.numImages;
      restrictions[8].pname = 0x8a33;
      restrictions[8].usage = usage.numCombinedUniformComponents;
      restrictions[9].pname = 0x90da;
      restrictions[9].usage = usage.numShaderStorageBlocks;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Fragment shader:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar8 = 1;
      for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
        bVar2 = checkLimit(restrictions[lVar6].pname,restrictions[lVar6].usage,gl,log);
        bVar8 = bVar8 & bVar2;
      }
      break;
    case SHADERTYPE_GEOMETRY:
      dVar3 = ProgramInterfaceDefinition::Program::getGeometryNumOutputVertices(program);
      iVar7 = dVar3 * usage.numOutputComponents;
      restrictions[0].pname = 0x8ddf;
      restrictions[0].usage = usage.numDefaultBlockUniformComponents;
      restrictions[1].pname = 0x8a2c;
      restrictions[1].usage = usage.numUniformBlocks;
      restrictions[2].pname = 0x9123;
      restrictions[2].usage = usage.numInputComponents;
      restrictions[3].pname = 0x9124;
      restrictions[3].usage = usage.numOutputComponents;
      restrictions[4].pname = 0x8de0;
      restrictions[4].usage =
           ProgramInterfaceDefinition::Program::getGeometryNumOutputVertices(program);
      restrictions[5].pname = 0x8de1;
      restrictions[6].pname = 0x8c29;
      restrictions[6].usage = usage.numSamplers;
      restrictions[7].pname = 0x92cf;
      restrictions[7].usage = usage.numAtomicCounterBuffers;
      restrictions[8].pname = 0x92d5;
      restrictions[8].usage = usage.numAtomicCounters;
      restrictions[9].pname = 0x90cd;
      restrictions[9].usage = usage.numImages;
      restrictions[10].pname = 0x90d7;
      restrictions[10].usage = usage.numShaderStorageBlocks;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      restrictions[5].usage = iVar7;
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Geometry shader:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar8 = 1;
      for (lVar6 = 0; lVar6 != 0xb; lVar6 = lVar6 + 1) {
        bVar2 = checkLimit(restrictions[lVar6].pname,restrictions[lVar6].usage,gl,log);
        bVar8 = bVar8 & bVar2;
      }
      break;
    case SHADERTYPE_TESSELLATION_CONTROL:
      dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      iVar7 = dVar3 * usage.numOutputComponents + usage.numPatchOutputComponents;
      restrictions[0].pname = 0x8e7d;
      restrictions[0].usage =
           ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      restrictions[1].pname = 0x8e84;
      restrictions[1].usage = usage.numPatchOutputComponents;
      restrictions[2].pname = 0x8e7f;
      restrictions[2].usage = usage.numDefaultBlockUniformComponents;
      restrictions[3].pname = 0x8e89;
      restrictions[3].usage = usage.numUniformBlocks;
      restrictions[4].pname = 0x886c;
      restrictions[4].usage = usage.numInputComponents;
      restrictions[5].pname = 0x8e83;
      restrictions[5].usage = usage.numOutputComponents;
      restrictions[6].pname = 0x8e85;
      restrictions[7].pname = 0x8e81;
      restrictions[7].usage = usage.numSamplers;
      restrictions[8].pname = 0x92cd;
      restrictions[8].usage = usage.numAtomicCounterBuffers;
      restrictions[9].pname = 0x92d3;
      restrictions[9].usage = usage.numAtomicCounters;
      restrictions[10].pname = 0x90cb;
      restrictions[10].usage = usage.numImages;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      restrictions[6].usage = iVar7;
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Tessellation control shader:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar8 = 1;
      for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 1) {
        bVar2 = checkLimit(restrictions[lVar6].pname,restrictions[lVar6].usage,gl,log);
        bVar8 = bVar8 & bVar2;
      }
      break;
    case SHADERTYPE_TESSELLATION_EVALUATION:
      restrictions[0].pname = 0x8e7d;
      restrictions[0].usage =
           ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      restrictions[1].pname = 0x8e84;
      restrictions[1].usage = usage.numPatchInputComponents;
      restrictions[2].pname = 0x8e80;
      restrictions[2].usage = usage.numDefaultBlockUniformComponents;
      restrictions[3].pname = 0x8e8a;
      restrictions[3].usage = usage.numUniformBlocks;
      restrictions[4].pname = 0x886d;
      restrictions[4].usage = usage.numInputComponents;
      restrictions[5].pname = 0x8e86;
      restrictions[5].usage = usage.numOutputComponents;
      restrictions[6].pname = 0x8e82;
      restrictions[6].usage = usage.numSamplers;
      restrictions[7].pname = 0x92ce;
      restrictions[7].usage = usage.numAtomicCounterBuffers;
      restrictions[8].pname = 0x92d4;
      restrictions[8].usage = usage.numAtomicCounters;
      restrictions[9].pname = 0x90cc;
      restrictions[9].usage = usage.numImages;
      restrictions[10].pname = 0x90d9;
      restrictions[10].usage = usage.numShaderStorageBlocks;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Tessellation evaluation shader:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar8 = 1;
      for (lVar6 = 0; lVar6 != 0xb; lVar6 = lVar6 + 1) {
        bVar2 = checkLimit(restrictions[lVar6].pname,restrictions[lVar6].usage,gl,log);
        bVar8 = bVar8 & bVar2;
      }
      break;
    case SHADERTYPE_COMPUTE:
      restrictions[0].pname = 0x91bb;
      restrictions[0].usage = usage.numUniformBlocks;
      restrictions[1].pname = 0x91bc;
      restrictions[1].usage = usage.numSamplers;
      restrictions[2].pname = 0x8263;
      restrictions[2].usage = usage.numDefaultBlockUniformComponents;
      restrictions[3].pname = 0x8264;
      restrictions[3].usage = usage.numAtomicCounterBuffers;
      restrictions[4].pname = 0x8265;
      restrictions[4].usage = usage.numAtomicCounters;
      restrictions[5].pname = 0x91bd;
      restrictions[5].usage = usage.numImages;
      restrictions[6].pname = 0x8266;
      restrictions[6].usage = usage.numCombinedUniformComponents;
      restrictions[7].pname = 0x90db;
      restrictions[7].usage = usage.numShaderStorageBlocks;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Compute shader:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar8 = 1;
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
        bVar2 = checkLimit(restrictions[lVar6].pname,restrictions[lVar6].usage,gl,log);
        bVar8 = bVar8 & bVar2;
      }
      break;
    default:
      bVar8 = 0;
    }
    bVar5 = bVar5 | bVar8 ^ 1;
  }
  getCombinedProgramResourceUsage((ProgramResourceUsage *)&usage,program);
  restrictions[0].pname = 0x8a2f;
  restrictions[0].usage = usage.numInputs + 1;
  restrictions[1].pname = 0x8a30;
  restrictions[1].usage = usage.numInputVectors;
  restrictions[2].pname = 0x8a2e;
  restrictions[2].usage = usage.numInputComponents;
  restrictions[3].pname = 0x8a31;
  restrictions[3].usage = usage.numOutputs;
  restrictions[4].pname = 0x8a33;
  restrictions[4].usage = usage.numOutputVectors;
  restrictions[5].pname = 0x8a32;
  restrictions[5].usage = usage.numOutputComponents;
  restrictions[6].pname = 0x8e1e;
  restrictions[6].usage = usage.numPatchInputComponents;
  restrictions[7].pname = 0x8e1f;
  restrictions[7].usage = usage.numPatchOutputComponents;
  restrictions[8].pname = 0x8b4b;
  restrictions[8].usage = usage.numSamplers;
  restrictions[9].pname = 0x8dfc;
  restrictions[9].usage = usage.numImages;
  restrictions[10].pname = 0x8b4d;
  restrictions[10].usage = usage.numAtomicCounterBuffers;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Program combined:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  bVar8 = 1;
  for (lVar9 = 0; lVar9 != 0x19; lVar9 = lVar9 + 1) {
    bVar2 = checkLimit(restrictions[lVar9].pname,restrictions[lVar9].usage,gl,log);
    bVar8 = bVar8 & bVar2;
  }
  if (bVar5 != 0 || (~bVar8 & 1) != 0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"One or more resource limits exceeded");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"one or more resource limits exceeded",
               (allocator<char> *)restrictions);
    tcu::NotSupportedError::NotSupportedError(this,(string *)local_1b0);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void checkProgramResourceUsage (const ProgramInterfaceDefinition::Program* program, const glw::Functions& gl, tcu::TestLog& log)
{
	bool limitExceeded = false;

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
		limitExceeded |= !checkShaderResourceUsage(program, program->getShaders()[shaderNdx], gl, log);

	limitExceeded |= !checkProgramCombinedResourceUsage(program, gl, log);

	if (limitExceeded)
	{
		log << tcu::TestLog::Message << "One or more resource limits exceeded" << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("one or more resource limits exceeded");
	}
}